

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::
VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody
          (VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test *this)

{
  byte bVar1;
  MapDynamicFieldInfo<const_google::protobuf::Message> info;
  undefined8 uVar2;
  FileDescriptor *pFVar3;
  bool bVar4;
  CppStringType CVar5;
  int iVar6;
  uint32_t *puVar7;
  FieldDescriptor *this_00;
  OneofDescriptor *pOVar8;
  RepeatedPtrField<google::protobuf::Message> *pRVar9;
  RepeatedPtrIterator<const_google::protobuf::Message> RVar10;
  RepeatedField<bool> *this_01;
  RepeatedField<double> *this_02;
  RepeatedField<float> *this_03;
  RepeatedField<long> *this_04;
  RepeatedField<int> *this_05;
  RepeatedField<unsigned_long> *this_06;
  RepeatedField<unsigned_int> *this_07;
  Descriptor *pDVar11;
  FieldDescriptor *pFVar12;
  ExtensionSet *this_08;
  KeyValue *pKVar13;
  KeyValue *pKVar14;
  reference ppVar15;
  Reflection *this_09;
  _func_int **pp_Var16;
  int i;
  uint uVar17;
  char *message;
  ulong uVar18;
  Message *this_10;
  ulong uVar19;
  KeyValue *pKVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  Metadata MVar33;
  iterator_range<google::protobuf::internal::RepeatedPtrIterator<const_google::protobuf::Message>_>
  iVar34;
  iterator iVar35;
  iterator iVar36;
  RepeatedPtrEntityDynamicFieldInfoBase<const_google::protobuf::Message,_google::protobuf::Message>
  local_148;
  undefined1 local_128 [16];
  Message *local_118;
  FieldDescriptor *local_110;
  MapFieldBase *local_108;
  int count;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  local_f8;
  uint32_t *local_e8;
  DescriptorPool *local_e0;
  Descriptor *extendee;
  FileDescriptor *local_d0;
  Arena *local_c8;
  Descriptor *local_c0;
  AssertionResult gtest_ar;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 aStack_90;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  prefetch;
  MapDynamicFieldInfo<const_google::protobuf::Message> local_78;
  iterator local_48;
  _func_int *local_38;
  
  local_38 = (_func_int *)&count;
  count = 0;
  this_10 = (this->super_VisitFieldsTest).message_;
  local_128._0_8_ = &local_38;
  local_128._12_4_ = 0x400;
  MVar33 = Message::GetMetadata(this_10);
  this_09 = MVar33.reflection;
  if (0 < (this_09->schema_).weak_field_map_offset_) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&gtest_ar,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
               ,99,"!schema.HasWeakFields()");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&gtest_ar,(char (*) [30])"weak fields are not supported");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&gtest_ar);
  }
  uVar18 = 0;
  local_d0 = (FileDescriptor *)this;
  if ((this_09->schema_).has_bits_offset_ == -1) {
    puVar7 = (uint32_t *)0x0;
  }
  else {
    puVar7 = Reflection::GetHasBits(this_09,this_10);
  }
  local_c0 = this_09->descriptor_;
  local_c8 = (Arena *)(this_09->schema_).has_bit_indices_;
  local_118 = this_10;
  local_e8 = puVar7;
  uVar19 = (ulong)(uint)local_c0->field_count_;
  if (local_c0->field_count_ < 1) {
    uVar19 = uVar18;
  }
  do {
    pFVar3 = local_d0;
    if (uVar18 == uVar19) {
      if ((this_09->schema_).extensions_offset_ != -1) {
        this_08 = Reflection::GetExtensionSet(this_09,this_10);
        extendee = this_09->descriptor_;
        local_e0 = this_09->descriptor_pool_;
        if ((short)this_08->flat_size_ < 0) {
          iVar35 = absl::lts_20250127::container_internal::
                   btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                   ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                            *)(this_08->map_).flat);
          iVar36 = absl::lts_20250127::container_internal::
                   btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                   ::end((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                          *)(this_08->map_).flat);
          local_48.node_ = iVar36.node_;
          local_148.reflection = (Reflection *)(local_128 + 0xc);
          local_148.message = (Message *)local_128;
          local_148.field = (FieldDescriptor *)&local_e0;
          local_148.const_repeated = (RepeatedPtrField<google::protobuf::Message> *)&extendee;
          local_48.position_ = iVar36.position_;
          prefetch._12_4_ = local_f8._12_4_;
          local_f8.node_ =
               (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                *)iVar35.node_;
          local_f8.position_ = iVar35.position_;
          prefetch.node_ =
               (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                *)iVar35.node_;
          prefetch.position_ = iVar35.position_;
          for (uVar17 = 0;
              (bVar4 = absl::lts_20250127::container_internal::
                       btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                       ::operator!=(&prefetch,&local_48), bVar4 && (uVar17 < 0x10));
              uVar17 = uVar17 + 1) {
            ppVar15 = absl::lts_20250127::container_internal::
                      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                      ::operator*(&prefetch);
            ExtensionSet::Extension::PrefetchPtr(&ppVar15->second);
            absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
            ::increment(&prefetch);
          }
          while( true ) {
            bVar4 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                    ::operator!=(&prefetch,&local_48);
            if (!bVar4) break;
            ppVar15 = absl::lts_20250127::container_internal::
                      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                      ::operator*(&local_f8);
            iVar6 = ppVar15->first;
            ppVar15 = absl::lts_20250127::container_internal::
                      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                      ::operator*(&local_f8);
            ReflectionVisit::
            VisitFields<google::protobuf::Message_const,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)::{lambda(auto:1)#1}>(google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)::{lambda(auto:1)#1}&&,google::protobuf::internal::FieldMask)
            ::{lambda(int,auto:1&)#1}::operator()(&local_148,iVar6,&ppVar15->second);
            ppVar15 = absl::lts_20250127::container_internal::
                      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                      ::operator*(&prefetch);
            ExtensionSet::Extension::PrefetchPtr(&ppVar15->second);
            absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
            ::increment(&local_f8);
            absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
            ::increment(&prefetch);
          }
          while (bVar4 = absl::lts_20250127::container_internal::
                         btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                         ::operator!=(&local_f8,&local_48), bVar4) {
            ppVar15 = absl::lts_20250127::container_internal::
                      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                      ::operator*(&local_f8);
            iVar6 = ppVar15->first;
            ppVar15 = absl::lts_20250127::container_internal::
                      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                      ::operator*(&local_f8);
            ReflectionVisit::
            VisitFields<google::protobuf::Message_const,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)::{lambda(auto:1)#1}>(google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)::{lambda(auto:1)#1}&&,google::protobuf::internal::FieldMask)
            ::{lambda(int,auto:1&)#1}::operator()(&local_148,iVar6,&ppVar15->second);
            absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
            ::increment(&local_f8);
          }
        }
        else {
          pKVar13 = ExtensionSet::flat_begin(this_08);
          pKVar14 = ExtensionSet::flat_end(this_08);
          local_148.reflection = (Reflection *)(local_128 + 0xc);
          local_148.message = (Message *)local_128;
          local_148.field = (FieldDescriptor *)&local_e0;
          local_148.const_repeated = (RepeatedPtrField<google::protobuf::Message> *)&extendee;
          pKVar20 = pKVar13;
          for (uVar17 = 0; (pKVar20 != pKVar14 && (uVar17 < 0x10)); uVar17 = uVar17 + 1) {
            ExtensionSet::Extension::PrefetchPtr(&pKVar20->second);
            pKVar20 = pKVar20 + 1;
          }
          for (; pKVar20 != pKVar14; pKVar20 = pKVar20 + 1) {
            ReflectionVisit::
            VisitFields<google::protobuf::Message_const,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)::{lambda(auto:1)#1}>(google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)::{lambda(auto:1)#1}&&,google::protobuf::internal::FieldMask)
            ::{lambda(int,auto:1&)#1}::operator()(&local_148,pKVar13->first,&pKVar13->second);
            ExtensionSet::Extension::PrefetchPtr(&pKVar20->second);
            pKVar13 = pKVar13 + 1;
          }
          for (; pKVar13 != pKVar14; pKVar13 = pKVar13 + 1) {
            ReflectionVisit::
            VisitFields<google::protobuf::Message_const,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)::{lambda(auto:1)#1}>(google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&,google::protobuf::internal::ReflectionVisit::VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)::{lambda(auto:1)#1}&&,google::protobuf::internal::FieldMask)
            ::{lambda(int,auto:1&)#1}::operator()(&local_148,pKVar13->first,&pKVar13->second);
          }
        }
      }
      local_78.reflection._0_4_ =
           CountAllMessageFieldsViaListFields
                     (*(Reflection **)&pFVar3[1].edition_,(Message *)pFVar3[1].pool_);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"count",
                 "CountAllMessageFieldsViaListFields(reflection_, *message_)",&count,
                 (int *)&local_78);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_78);
        if ((undefined8 *)
            CONCAT44(gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_,
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._0_4_) == (undefined8 *)0x0) {
          message = anon_var_dwarf_651463 + 5;
        }
        else {
          message = *(char **)CONCAT44(gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_148,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields_test.cc"
                   ,0x71,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
        if ((long *)CONCAT44(local_78.reflection._4_4_,(int)local_78.reflection) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_78.reflection._4_4_,(int)local_78.reflection) + 8))()
          ;
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      return;
    }
    this_00 = Descriptor::field(local_c0,(int)uVar18);
    if ((this_00->options_->field_0)._impl_.weak_ == true) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                 ,0x6e,"!field->options().weak()");
      absl::lts_20250127::log_internal::LogMessage::operator<<
                ((LogMessage *)&local_148,(char (*) [30])"weak fields are not supported");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_148);
    }
    if ((local_128._12_4_ != 0xffffffff) &&
       (((uint)local_128._12_4_ >>
         (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this_00->type_ * 4) & 0x1f) & 1) ==
        0)) goto LAB_00726f4b;
    bVar4 = FieldDescriptor::is_repeated(this_00);
    if (!bVar4) {
      pOVar8 = FieldDescriptor::real_containing_oneof(this_00);
      if (pOVar8 == (OneofDescriptor *)0x0) {
        if ((puVar7 == (uint32_t *)0x0) ||
           (uVar17 = ((__atomic_base<unsigned_int> *)&(local_c8->impl_).tag_and_id_)[uVar18]._M_i,
           uVar17 == 0xffffffff)) {
          bVar4 = Reflection::HasFieldSingular(this_09,this_10,this_00);
          if (bVar4) goto LAB_00726c1e;
        }
        else if ((puVar7[uVar17 >> 5] >> (uVar17 & 0x1f) & 1) != 0) {
LAB_00726c1e:
          pp_Var16 = (_func_int **)local_128._0_8_;
          bVar1 = this_00->type_;
          if (0x12 < bVar1) {
LAB_0072762d:
            Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                        ,0x12d);
          }
          if ((0x7e1feU >> (bVar1 & 0x1f) & 1) == 0) {
            if ((0xc00U >> (bVar1 & 0x1f) & 1) != 0) {
              local_148.reflection = this_09;
              local_148.message = this_10;
              local_148.field = this_00;
              MessageDynamicFieldInfo<const_google::protobuf::Message,_false>::Get
                        ((MessageDynamicFieldInfo<const_google::protobuf::Message,_false> *)
                         &local_148,(MessageFactory *)0x0);
              goto LAB_00726f46;
            }
            if ((0x1200U >> (bVar1 & 0x1f) & 1) == 0) goto LAB_0072762d;
            goto LAB_00726c55;
          }
        }
      }
      else {
        pOVar8 = FieldDescriptor::containing_oneof(this_00);
        pp_Var16 = (_func_int **)local_128._0_8_;
        if ((ulong)*(uint *)((long)&(this_10->super_MessageLite)._vptr_MessageLite +
                            (long)(int)(((long)pOVar8 - (long)pOVar8->containing_type_->oneof_decls_
                                        ) / 0x38) * 4 +
                            (ulong)(uint)(this_09->schema_).oneof_case_offset_) !=
            (long)this_00->number_) goto LAB_00726f4b;
        bVar1 = this_00->type_;
        if (0x12 < bVar1) {
LAB_0072761c:
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                      ,0xf6);
        }
        if ((0x7e1feU >> (bVar1 & 0x1f) & 1) != 0) goto LAB_00726f4b;
        if ((0xc00U >> (bVar1 & 0x1f) & 1) == 0) {
          if ((0x1200U >> (bVar1 & 0x1f) & 1) == 0) goto LAB_0072761c;
LAB_00726c55:
          FieldDescriptor::cpp_string_type(this_00);
        }
        else {
          local_148.reflection = this_09;
          local_148.message = this_10;
          local_148.field = this_00;
          MessageDynamicFieldInfo<const_google::protobuf::Message,_true>::Get
                    ((MessageDynamicFieldInfo<const_google::protobuf::Message,_true> *)&local_148,
                     (MessageFactory *)0x0);
LAB_00726f46:
          *(int *)*pp_Var16 = *(int *)*pp_Var16 + 1;
        }
      }
      goto LAB_00726f4b;
    }
    switch(this_00->type_) {
    case '\x01':
      bVar4 = FieldDescriptor::is_map(this_00);
      if (bVar4) {
        iVar6 = 0x7f;
LAB_007273b7:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_148,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                   ,iVar6,"!field->is_map()");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_148);
      }
      this_02 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<double>>
                          (this_09,this_10,this_00);
      RepeatedField<double>::size(this_02);
      break;
    case '\x02':
      bVar4 = FieldDescriptor::is_map(this_00);
      if (bVar4) {
        iVar6 = 0x80;
        goto LAB_007273b7;
      }
      this_03 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<float>>
                          (this_09,this_10,this_00);
      RepeatedField<float>::size(this_03);
      break;
    case '\x03':
      bVar4 = FieldDescriptor::is_map(this_00);
      if (bVar4) {
        iVar6 = 0x81;
        goto LAB_007273b7;
      }
      goto LAB_00726df3;
    case '\x04':
      bVar4 = FieldDescriptor::is_map(this_00);
      if (bVar4) {
        iVar6 = 0x82;
        goto LAB_007273b7;
      }
      goto LAB_00726e49;
    case '\x05':
      bVar4 = FieldDescriptor::is_map(this_00);
      if (bVar4) {
        iVar6 = 0x83;
        goto LAB_007273b7;
      }
      goto LAB_00726e1e;
    case '\x06':
      bVar4 = FieldDescriptor::is_map(this_00);
      if (bVar4) {
        iVar6 = 0x84;
        goto LAB_007273b7;
      }
LAB_00726e49:
      this_06 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_long>>
                          (this_09,this_10,this_00);
      RepeatedField<unsigned_long>::size(this_06);
      break;
    case '\a':
      bVar4 = FieldDescriptor::is_map(this_00);
      if (bVar4) {
        iVar6 = 0x85;
        goto LAB_007273b7;
      }
      goto LAB_00726eec;
    case '\b':
      bVar4 = FieldDescriptor::is_map(this_00);
      if (bVar4) {
        iVar6 = 0x86;
        goto LAB_007273b7;
      }
      this_01 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<bool>>
                          (this_09,this_10,this_00);
      RepeatedField<bool>::size(this_01);
      break;
    case '\t':
    case '\f':
      CVar5 = FieldDescriptor::cpp_string_type(this_00);
      if (CVar5 - kView < 3) {
        Reflection::GetRawNonOneof<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                  (this_09,this_10,this_00);
      }
      break;
    case '\n':
      bVar4 = FieldDescriptor::is_map(this_00);
      if (bVar4) {
        local_108 = Reflection::GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                              (this_09,this_10,this_00);
        iVar6 = MapFieldBase::size(local_108);
        if (iVar6 != 0) {
          pDVar11 = FieldDescriptor::message_type(this_00);
          local_110 = Descriptor::map_key(pDVar11);
          this_10 = local_118;
          pFVar12 = Descriptor::map_value(pDVar11);
          MapDynamicFieldInfo<const_google::protobuf::Message>::MapDynamicFieldInfo
                    (&local_78,this_09,this_10,this_00,local_110,pFVar12,local_108);
          uVar21 = (int)local_78.reflection;
          uVar22 = local_78.reflection._4_4_;
          uVar23 = local_78.message._0_4_;
          uVar24 = local_78.message._4_4_;
          uVar25 = local_78.field._0_4_;
          uVar26 = local_78.field._4_4_;
          uVar27 = local_78.key._0_4_;
          uVar28 = local_78.key._4_4_;
          uVar29 = local_78.value._0_4_;
          uVar30 = local_78.value._4_4_;
          uVar31 = (int32_t)local_78.const_map_field;
          uVar32 = local_78.const_map_field._4_4_;
LAB_0072708d:
          info.reflection._4_4_ = uVar22;
          info.reflection._0_1_ = SUB41(uVar21,0);
          info.reflection._1_3_ = SUB43(uVar21,1);
          info.message._0_4_ = uVar23;
          info.message._4_4_ = uVar24;
          info.field._0_4_ = uVar25;
          info.field._4_4_ = uVar26;
          info.key._0_4_ = uVar27;
          info.key._4_4_ = uVar28;
          info.value._0_4_ = uVar29;
          info.value._4_4_ = uVar30;
          info.const_map_field._0_4_ = uVar31;
          info.const_map_field._4_4_ = uVar32;
          ReflectionVisit::
          VisitMessageFields<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0>(google::protobuf::Message_const&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_VisitMessageFieldsCountIncludesRepeatedElements_Test::TestBody()::$_0&&)
          ::{lambda(auto:1)#1}::operator()((_lambda_auto_1__1_ *)local_128,info);
        }
      }
      else {
        pRVar9 = Reflection::
                 GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                           (this_09,this_10,this_00);
        if ((pRVar9->super_RepeatedPtrFieldBase).current_size_ != 0) {
          local_148.reflection = this_09;
          local_148.message = this_10;
          local_148.field = this_00;
          local_148.const_repeated = pRVar9;
          iVar34 = RepeatedPtrEntityDynamicFieldInfoBase<const_google::protobuf::Message,_google::protobuf::Message>
                   ::Get(&local_148);
          for (RVar10 = iVar34.begin_iterator_.it_; uVar2 = local_128._0_8_, puVar7 = local_e8,
              this_10 = local_118, RVar10.it_ != iVar34.end_iterator_.it_.it_;
              RVar10.it_ = RVar10.it_ + 1) {
            DownCastMessage<google::protobuf::Message>((MessageLite *)*RVar10.it_);
            *(int *)*(_func_int **)uVar2 = *(int *)*(_func_int **)uVar2 + 1;
          }
        }
      }
      break;
    case '\v':
      bVar4 = FieldDescriptor::is_map(this_00);
      if (bVar4) {
        local_108 = Reflection::GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                              (this_09,this_10,this_00);
        iVar6 = MapFieldBase::size(local_108);
        if (iVar6 != 0) {
          pDVar11 = FieldDescriptor::message_type(this_00);
          local_110 = Descriptor::map_key(pDVar11);
          this_10 = local_118;
          pFVar12 = Descriptor::map_value(pDVar11);
          MapDynamicFieldInfo<const_google::protobuf::Message>::MapDynamicFieldInfo
                    ((MapDynamicFieldInfo<const_google::protobuf::Message> *)&gtest_ar,this_09,
                     this_10,this_00,local_110,pFVar12,local_108);
          uVar21 = gtest_ar._0_4_;
          uVar22 = gtest_ar._4_4_;
          uVar23 = gtest_ar.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._0_4_;
          uVar24 = gtest_ar.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_;
          uVar25 = local_a8;
          uVar26 = uStack_a4;
          uVar27 = uStack_a0;
          uVar28 = uStack_9c;
          uVar29 = local_98;
          uVar30 = uStack_94;
          uVar31 = aStack_90.default_value_int32_t_;
          uVar32 = aStack_90.default_value_int64_t_._4_4_;
          goto LAB_0072708d;
        }
      }
      else {
        pRVar9 = Reflection::
                 GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                           (this_09,this_10,this_00);
        if ((pRVar9->super_RepeatedPtrFieldBase).current_size_ != 0) {
          local_148.reflection = this_09;
          local_148.message = this_10;
          local_148.field = this_00;
          local_148.const_repeated = pRVar9;
          iVar34 = RepeatedPtrEntityDynamicFieldInfoBase<const_google::protobuf::Message,_google::protobuf::Message>
                   ::Get(&local_148);
          for (RVar10 = iVar34.begin_iterator_.it_; uVar2 = local_128._0_8_, puVar7 = local_e8,
              this_10 = local_118, RVar10.it_ != iVar34.end_iterator_.it_.it_;
              RVar10.it_ = RVar10.it_ + 1) {
            DownCastMessage<google::protobuf::Message>((MessageLite *)*RVar10.it_);
            *(int *)*(_func_int **)uVar2 = *(int *)*(_func_int **)uVar2 + 1;
          }
        }
      }
      break;
    case '\r':
      bVar4 = FieldDescriptor::is_map(this_00);
      if (bVar4) {
        iVar6 = 0x87;
        goto LAB_007273b7;
      }
LAB_00726eec:
      this_07 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_int>>
                          (this_09,this_10,this_00);
      RepeatedField<unsigned_int>::size(this_07);
      break;
    case '\x0e':
      bVar4 = FieldDescriptor::is_map(this_00);
      if (bVar4) {
        iVar6 = 0x88;
        goto LAB_007273b7;
      }
      goto LAB_00726e1e;
    case '\x0f':
      bVar4 = FieldDescriptor::is_map(this_00);
      if (bVar4) {
        iVar6 = 0x89;
        goto LAB_007273b7;
      }
      goto LAB_00726e1e;
    case '\x10':
      bVar4 = FieldDescriptor::is_map(this_00);
      if (bVar4) {
        iVar6 = 0x8a;
        goto LAB_007273b7;
      }
      goto LAB_00726df3;
    case '\x11':
      bVar4 = FieldDescriptor::is_map(this_00);
      if (bVar4) {
        iVar6 = 0x8b;
        goto LAB_007273b7;
      }
LAB_00726e1e:
      this_05 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<int>>
                          (this_09,this_10,this_00);
      RepeatedField<int>::size(this_05);
      break;
    case '\x12':
      bVar4 = FieldDescriptor::is_map(this_00);
      if (bVar4) {
        iVar6 = 0x8c;
        goto LAB_007273b7;
      }
LAB_00726df3:
      this_04 = Reflection::GetRawNonOneof<google::protobuf::RepeatedField<long>>
                          (this_09,this_10,this_00);
      RepeatedField<long>::size(this_04);
      break;
    default:
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                  ,0xbb);
    }
LAB_00726f4b:
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

TEST_P(VisitFieldsTest, VisitMessageFieldsCountIncludesRepeatedElements) {
  int count = 0;
  VisitMessageFields(*message_, [&](const Message& msg) { ++count; });

  EXPECT_EQ(count, CountAllMessageFieldsViaListFields(reflection_, *message_));
}